

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_gains.hpp
# Opt level: O1

void __thiscall
ear::OutputGainMatVecT<float>::check_size(OutputGainMatVecT<float> *this,size_t rows,size_t cols)

{
  long *plVar1;
  long *plVar2;
  invalid_argument *piVar3;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  plVar2 = *(long **)this->mat;
  plVar1 = *(long **)(this->mat + 8);
  if (((long)plVar1 - (long)plVar2 >> 3) * -0x5555555555555555 - cols != 0) {
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"incorrect number of cols in output matrix","");
    std::invalid_argument::invalid_argument(piVar3,(string *)local_40);
    *(undefined ***)piVar3 = &PTR__invalid_argument_002100a8;
    __cxa_throw(piVar3,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  while( true ) {
    if (plVar2 == plVar1) {
      return;
    }
    if (plVar2[1] - *plVar2 >> 2 != rows) break;
    plVar2 = plVar2 + 3;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"incorrect number of rows in output matrix column","");
  std::invalid_argument::invalid_argument(piVar3,(string *)local_40);
  *(undefined ***)piVar3 = &PTR__invalid_argument_002100a8;
  __cxa_throw(piVar3,&invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

virtual void check_size(size_t rows, size_t cols) override {
      if (mat.size() != cols)
        throw invalid_argument("incorrect number of cols in output matrix");
      for (auto &col : mat)
        if (col.size() != rows)
          throw invalid_argument(
              "incorrect number of rows in output matrix column");
    }